

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint local_1a0;
  uint numThreads;
  RGBColor *local_198;
  undefined8 local_190;
  RGBColor *local_188;
  reference_wrapper<pm::PinHole> local_180;
  reference_wrapper<pm::GlobalTrace> local_178;
  reference_wrapper<pm::World> local_170;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  GlobalTrace tracer;
  World world;
  PinHole local_90;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Poor Man\'s Tracer \n\n",0x14);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setting up the scene...\n",0x18);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  local_198 = (RGBColor *)operator_new__(0xa8c000);
  memset(local_198,0,0xa8c000);
  pm::World::World(&world);
  tracer.super_Tracer.type_ = GLOBALTRACE;
  tracer.super_Tracer._vptr_Tracer = (_func_int **)&PTR__Tracer_00114a00;
  setupCornellBox(&world);
  world.viewplane_.pixelSize_ = 0.004;
  validateWorld(&world);
  local_90.super_Camera.type_ = PINHOLE;
  local_90.super_Camera.v_.x = 0.0;
  local_90.super_Camera.v_.y = 1.0;
  local_90.super_Camera.v_.z = 0.0;
  local_90.super_Camera.w_.x = 0.0;
  local_90.super_Camera._vptr_Camera = (_func_int **)&PTR__Camera_00114b58;
  local_90.zoom_ = 1.0;
  local_90.super_Camera.up_.z = 0.0;
  local_90.super_Camera.u_.x = 1.0;
  local_90.super_Camera.u_.y = 0.0;
  local_90.super_Camera.u_.z = 0.0;
  local_90.super_Camera.eye_.x = 278.0;
  local_90.super_Camera.eye_.y = 273.0;
  local_90.super_Camera.eye_.z = -800.0;
  local_90.super_Camera.lookAt_.x = 278.0;
  local_90.super_Camera.lookAt_.y = 273.0;
  local_90.super_Camera.lookAt_.z = 0.0;
  local_90.super_Camera.up_.x = 0.0;
  local_90.super_Camera.up_.y = 1.0;
  local_90.super_Camera.w_.y = 0.0;
  local_90.super_Camera.w_.z = 1.0;
  local_90.super_Camera.exposureTime_ = 1.0;
  local_90.distance_ = 4.0;
  pm::Camera::computeUvw(&local_90.super_Camera);
  numThreads = std::thread::hardware_concurrency();
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)numThreads;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,uVar3);
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Scene setting time: ",0x14);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms\n",3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Scene statistics: ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," objects, ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," materials, ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," lights, ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," samplers\n",10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rendering started",0x11)
  ;
  uVar2 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," with ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," threads...\n",0xc);
  std::ostream::flush();
  local_1a0 = 0;
  if (uVar3 != 0) {
    local_190 = uVar2;
    do {
      local_170._M_data = &world;
      local_178._M_data = &tracer;
      local_180._M_data = &local_90;
      local_188 = local_198;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(int,int,pm::World&,pm::Tracer&,pm::Camera&,pm::RGBColor*),unsigned_int&,unsigned_int_const&,std::reference_wrapper<pm::World>,std::reference_wrapper<pm::GlobalTrace>,std::reference_wrapper<pm::PinHole>,pm::RGBColor*>
                ((vector<std::thread,std::allocator<std::thread>> *)&threads,threadFunc,&local_1a0,
                 &numThreads,&local_170,&local_178,&local_180,&local_188);
      local_1a0 = local_1a0 + 1;
    } while (local_1a0 < numThreads);
    if (numThreads != 0) {
      uVar3 = 0;
      do {
        std::thread::join();
        uVar3 = uVar3 + 1;
      } while (uVar3 < numThreads);
    }
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rendering time: ",0x10);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms\n",3);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  savePbm("image.pbm",local_198,&world.viewplane_);
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File save time: ",0x10);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms\n",3);
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ::~vector(&world.samplers_);
  std::
  vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ::~vector(&world.lights_);
  if ((__uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>)
      world.ambientLight_._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>.
      _M_t.super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
      super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>)0x0) {
    (**(code **)(*(long *)world.ambientLight_._M_t.
                          super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
                          super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
                          super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl + 8))();
  }
  world.ambientLight_._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
  super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
  super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::Light,_std::default_delete<pm::Light>,_true,_true>)
       (__uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>)0x0;
  std::
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ::~vector(&world.materials_);
  std::
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ::~vector(&world.objects_);
  operator_delete__(local_198);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Poor Man's Tracer \n\n" << std::flush;

	std::cout << "Setting up the scene...\n" << std::flush;
	auto startTime = std::chrono::high_resolution_clock::now();

	std::unique_ptr<pm::RGBColor[]> frame = std::make_unique<pm::RGBColor[]>(Width * Height);

	pm::World world;

#if CORNELL_BOX
	pm::GlobalTrace tracer;
	setupCornellBox(world);
#else
	setupWorld(world);
	pm::AreaLighting tracer;
#endif

	world.viewPlane().editPixelSize() = 0.004f;
	validateWorld(world);

	pm::PinHole camera;
#if CORNELL_BOX
	camera.editEye().set(278.0f, 273.0f, -800.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(278.0f, 273.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#else
	camera.editEye().set(0.0f, 2.0f, -8.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 2.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

#if 0
	//pm::Ortographic camera;
	world.viewPlane().setPixelSize(0.005f);

	pm::PinHole camera;
	camera.editEye().set(0.0f, 1.0f, -5.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 1.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

	const unsigned int numThreads = std::thread::hardware_concurrency();
	std::vector<std::thread> threads;
	threads.reserve(numThreads);

	auto endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Scene setting time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	std::cout << "Scene statistics: " << world.objects().size() << " objects, " << world.materials().size() << " materials, " <<
	             world.lights().size() << " lights, " << world.samplers().size() << " samplers\n" << std::flush;

	std::cout << "Rendering started";
	startTime = std::chrono::high_resolution_clock::now();

#if THREADING_TYPE == 0
	std::cout << " with one thread...\n" << std::flush;
	camera.renderScene(world, tracer, frame.get());
#elif THREADING_TYPE == 1
	std::cout << " with one thread (tiled)...\n" << std::flush;
	for (int i = 0; i < height; i += tileSize)
		for (int j = 0; j < width; j += tileSize)
			camera.renderScene(world, tracer, frame.get(), j, i, tileSize);
#elif THREADING_TYPE == 2
	std::cout << " with " << numThreads << " threads...\n" << std::flush;
	for (unsigned int i = 0; i < numThreads; i++)
		threads.emplace_back(threadFunc, i, numThreads, std::ref(world), std::ref(tracer), std::ref(camera), frame.get());
	for (unsigned int i = 0; i < numThreads; i++)
		threads[i].join();
#endif

	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Rendering time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	// Save output to PBM binary or ascii format
	startTime = std::chrono::high_resolution_clock::now();
	savePbm("image.pbm", frame.get(), world.viewPlane());
	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "File save time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	return EXIT_SUCCESS;
}